

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O0

VmValue * CompileVmTypeCast(ExpressionContext *ctx,VmModule *module,ExprTypeCast *node)

{
  SynBase *pSVar1;
  TypeBase *type;
  VmModule *pVVar2;
  VmType type_00;
  bool bVar3;
  VmValue *pVVar4;
  VmConstant *el1;
  VmConstant *pVVar5;
  TypeArray *pTVar6;
  VmConstant *pVVar7;
  TypeClass *pTVar8;
  TypeRef *pTVar9;
  TypeUnsizedArray *pTVar10;
  VmValue *pVVar11;
  VmInstruction *pVVar12;
  VmValue *in_R9;
  VmType target;
  VmType VVar13;
  VmType type_01;
  VmType type_02;
  VmType type_03;
  VmType type_04;
  VmType type_05;
  VmType type_06;
  VmType type_07;
  VmType type_08;
  VmType type_09;
  VmType type_10;
  uint in_stack_fffffffffffffb78;
  VmValue *in_stack_fffffffffffffb88;
  SynBase *local_198;
  TypeBase *local_190;
  undefined8 local_188;
  TypeBase *local_180;
  VmInstruction *inst_2;
  TypeBase *local_168;
  undefined8 local_160;
  TypeBase *local_158;
  VmInstruction *inst_1;
  TypeBase *local_140;
  undefined8 local_138;
  TypeBase *local_130;
  VmInstruction *inst;
  TypeBase *local_118;
  TypeUnsizedArray *unsizedType;
  TypeRef *refType_2;
  TypeBase *local_f8;
  VmValue *local_f0;
  VmValue *typeId;
  TypeClass *classType;
  TypeRef *refType_1;
  TypeBase *local_d0;
  TypeArray *arrType;
  TypeRef *refType;
  TypeBase *local_b0;
  SynBase *local_a8;
  TypeBase *local_a0;
  SynBase *local_98;
  TypeBase *local_90;
  SynBase *local_88;
  TypeBase *local_80;
  VmValue *index;
  TypeBase *local_58;
  VmValue *ptr;
  TypeUnsizedArray *unsizedArrType;
  TypeBase *local_38;
  VmValue *value;
  ExprTypeCast *node_local;
  VmModule *module_local;
  ExpressionContext *ctx_local;
  
  pVVar4 = CompileVm(ctx,module,node->value);
  switch(node->category) {
  case EXPR_CAST_NUMERICAL:
    if ((node->super_ExprBase).type == ctx->typeBool) {
      bVar3 = VmType::operator==(&pVVar4->type,&VmType::Int);
      if (bVar3) {
        pSVar1 = (node->super_ExprBase).source;
        pVVar7 = CreateConstantInt(module->allocator,(node->super_ExprBase).source,0);
        pVVar4 = anon_unknown.dwarf_aa461::CreateCompareNotEqual
                           (module,pSVar1,pVVar4,&pVVar7->super_VmValue);
        ctx_local = (ExpressionContext *)
                    anon_unknown.dwarf_aa461::CheckType(ctx,&node->super_ExprBase,pVVar4);
      }
      else {
        bVar3 = VmType::operator==(&pVVar4->type,&VmType::Double);
        if (bVar3) {
          pSVar1 = (node->super_ExprBase).source;
          pVVar7 = CreateConstantDouble(module->allocator,(node->super_ExprBase).source,0.0);
          pVVar4 = anon_unknown.dwarf_aa461::CreateCompareNotEqual
                             (module,pSVar1,pVVar4,&pVVar7->super_VmValue);
          ctx_local = (ExpressionContext *)
                      anon_unknown.dwarf_aa461::CheckType(ctx,&node->super_ExprBase,pVVar4);
        }
        else {
          bVar3 = VmType::operator==(&pVVar4->type,&VmType::Long);
          if (!bVar3) {
            __assert_fail("!\"unknown type\"",
                          "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                          ,0xa95,
                          "VmValue *CompileVmTypeCast(ExpressionContext &, VmModule *, ExprTypeCast *)"
                         );
          }
          pSVar1 = (node->super_ExprBase).source;
          pVVar7 = CreateConstantLong(module->allocator,(node->super_ExprBase).source,0);
          pVVar4 = anon_unknown.dwarf_aa461::CreateCompareNotEqual
                             (module,pSVar1,pVVar4,&pVVar7->super_VmValue);
          ctx_local = (ExpressionContext *)
                      anon_unknown.dwarf_aa461::CheckType(ctx,&node->super_ExprBase,pVVar4);
        }
      }
    }
    else {
      pVVar2 = (VmModule *)(node->super_ExprBase).source;
      VVar13 = GetVmType(ctx,(node->super_ExprBase).type);
      unsizedArrType = VVar13._0_8_;
      local_38 = VVar13.structType;
      target.structType = (TypeBase *)in_R9;
      target._0_8_ = local_38;
      pVVar4 = anon_unknown.dwarf_aa461::CreateCast
                         ((anon_unknown_dwarf_aa461 *)module,pVVar2,(SynBase *)pVVar4,
                          (VmValue *)unsizedArrType,target);
      ctx_local = (ExpressionContext *)
                  anon_unknown.dwarf_aa461::CheckType(ctx,&node->super_ExprBase,pVVar4);
    }
    break;
  case EXPR_CAST_PTR_TO_BOOL:
    pSVar1 = (node->super_ExprBase).source;
    pVVar7 = CreateConstantPointer
                       (module->allocator,(node->super_ExprBase).source,0,(VariableData *)0x0,
                        ctx->typeNullPtr,false);
    pVVar4 = anon_unknown.dwarf_aa461::CreateCompareNotEqual
                       (module,pSVar1,pVVar4,&pVVar7->super_VmValue);
    ctx_local = (ExpressionContext *)
                anon_unknown.dwarf_aa461::CheckType(ctx,&node->super_ExprBase,pVVar4);
    break;
  case EXPR_CAST_UNSIZED_TO_BOOL:
    pTVar10 = getType<TypeUnsizedArray>(node->value->type);
    if (pTVar10 != (TypeUnsizedArray *)0x0) {
      pVVar2 = (VmModule *)(node->super_ExprBase).source;
      pTVar9 = ExpressionContext::GetReferenceType(ctx,pTVar10->subType);
      VVar13 = VmType::Pointer(&pTVar9->super_TypeBase);
      index = VVar13._0_8_;
      local_58 = VVar13.structType;
      type_01.structType = (TypeBase *)pVVar4;
      type_01._0_8_ = local_58;
      pVVar4 = anon_unknown.dwarf_aa461::CreateExtract
                         ((anon_unknown_dwarf_aa461 *)module,pVVar2,(SynBase *)index,type_01,
                          (VmValue *)0x0,in_stack_fffffffffffffb78);
      pSVar1 = (node->super_ExprBase).source;
      pVVar7 = CreateConstantPointer
                         (module->allocator,(node->super_ExprBase).source,0,(VariableData *)0x0,
                          ctx->typeNullPtr,false);
      pVVar4 = anon_unknown.dwarf_aa461::CreateCompareNotEqual
                         (module,pSVar1,pVVar4,&pVVar7->super_VmValue);
      pVVar4 = anon_unknown.dwarf_aa461::CheckType(ctx,&node->super_ExprBase,pVVar4);
      return pVVar4;
    }
    goto LAB_0020735b;
  case EXPR_CAST_FUNCTION_TO_BOOL:
    type_02.structType = (TypeBase *)pVVar4;
    type_02._0_8_ = VmType::Int.structType;
    pVVar11 = anon_unknown.dwarf_aa461::CreateExtract
                        ((anon_unknown_dwarf_aa461 *)module,
                         (VmModule *)(node->super_ExprBase).source,(SynBase *)VmType::Int._0_8_,
                         type_02,(VmValue *)0x8,in_stack_fffffffffffffb78);
    if (pVVar11 != (VmValue *)0x0) {
      pSVar1 = (node->super_ExprBase).source;
      pVVar7 = CreateConstantInt(module->allocator,(node->super_ExprBase).source,0);
      pVVar4 = anon_unknown.dwarf_aa461::CreateCompareNotEqual
                         (module,pSVar1,pVVar11,&pVVar7->super_VmValue);
      pVVar4 = anon_unknown.dwarf_aa461::CheckType(ctx,&node->super_ExprBase,pVVar4);
      return pVVar4;
    }
    goto LAB_0020735b;
  case EXPR_CAST_NULL_TO_PTR:
    pVVar7 = CreateConstantPointer
                       (module->allocator,(node->super_ExprBase).source,0,(VariableData *)0x0,
                        (node->super_ExprBase).type,false);
    ctx_local = (ExpressionContext *)
                anon_unknown.dwarf_aa461::CheckType
                          (ctx,&node->super_ExprBase,&pVVar7->super_VmValue);
    break;
  case EXPR_CAST_NULL_TO_AUTO_PTR:
    pVVar2 = (VmModule *)(node->super_ExprBase).source;
    VVar13 = GetVmType(ctx,(node->super_ExprBase).type);
    pVVar7 = CreateConstantInt(module->allocator,(node->super_ExprBase).source,0);
    pVVar5 = CreateConstantPointer
                       (module->allocator,(node->super_ExprBase).source,0,(VariableData *)0x0,
                        ctx->typeNullPtr,false);
    local_88 = VVar13._0_8_;
    local_80 = VVar13.structType;
    type_03.structType = (TypeBase *)pVVar7;
    type_03._0_8_ = local_80;
    pVVar4 = anon_unknown.dwarf_aa461::CreateConstruct
                       ((anon_unknown_dwarf_aa461 *)module,pVVar2,local_88,type_03,
                        &pVVar5->super_VmValue,(VmValue *)0x0,(VmValue *)0x0,
                        in_stack_fffffffffffffb88);
    ctx_local = (ExpressionContext *)
                anon_unknown.dwarf_aa461::CheckType(ctx,&node->super_ExprBase,pVVar4);
    break;
  case EXPR_CAST_NULL_TO_UNSIZED:
    pVVar2 = (VmModule *)(node->super_ExprBase).source;
    VVar13 = GetVmType(ctx,(node->super_ExprBase).type);
    pVVar7 = CreateConstantPointer
                       (module->allocator,(node->super_ExprBase).source,0,(VariableData *)0x0,
                        ctx->typeNullPtr,false);
    pVVar5 = CreateConstantInt(module->allocator,(node->super_ExprBase).source,0);
    local_98 = VVar13._0_8_;
    local_90 = VVar13.structType;
    type_04.structType = (TypeBase *)pVVar7;
    type_04._0_8_ = local_90;
    pVVar4 = anon_unknown.dwarf_aa461::CreateConstruct
                       ((anon_unknown_dwarf_aa461 *)module,pVVar2,local_98,type_04,
                        &pVVar5->super_VmValue,(VmValue *)0x0,(VmValue *)0x0,
                        in_stack_fffffffffffffb88);
    ctx_local = (ExpressionContext *)
                anon_unknown.dwarf_aa461::CheckType(ctx,&node->super_ExprBase,pVVar4);
    break;
  case EXPR_CAST_NULL_TO_AUTO_ARRAY:
    pVVar2 = (VmModule *)(node->super_ExprBase).source;
    VVar13 = GetVmType(ctx,(node->super_ExprBase).type);
    pVVar7 = CreateConstantInt(module->allocator,(node->super_ExprBase).source,0);
    pVVar5 = CreateConstantPointer
                       (module->allocator,(node->super_ExprBase).source,0,(VariableData *)0x0,
                        ctx->typeNullPtr,false);
    el1 = CreateConstantInt(module->allocator,(node->super_ExprBase).source,0);
    local_a8 = VVar13._0_8_;
    local_a0 = VVar13.structType;
    type_05.structType = (TypeBase *)pVVar7;
    type_05._0_8_ = local_a0;
    pVVar4 = anon_unknown.dwarf_aa461::CreateConstruct
                       ((anon_unknown_dwarf_aa461 *)module,pVVar2,local_a8,type_05,
                        &pVVar5->super_VmValue,&el1->super_VmValue,(VmValue *)0x0,
                        in_stack_fffffffffffffb88);
    ctx_local = (ExpressionContext *)
                anon_unknown.dwarf_aa461::CheckType(ctx,&node->super_ExprBase,pVVar4);
    break;
  case EXPR_CAST_NULL_TO_FUNCTION:
    pVVar2 = (VmModule *)(node->super_ExprBase).source;
    VVar13 = GetVmType(ctx,(node->super_ExprBase).type);
    pVVar7 = CreateConstantPointer
                       (module->allocator,(node->super_ExprBase).source,0,(VariableData *)0x0,
                        ctx->typeNullPtr,false);
    pVVar5 = CreateConstantInt(module->allocator,(node->super_ExprBase).source,0);
    refType = VVar13._0_8_;
    local_b0 = VVar13.structType;
    type_06.structType = (TypeBase *)pVVar7;
    type_06._0_8_ = local_b0;
    pVVar4 = anon_unknown.dwarf_aa461::CreateConstruct
                       ((anon_unknown_dwarf_aa461 *)module,pVVar2,(SynBase *)refType,type_06,
                        &pVVar5->super_VmValue,(VmValue *)0x0,(VmValue *)0x0,
                        in_stack_fffffffffffffb88);
    ctx_local = (ExpressionContext *)
                anon_unknown.dwarf_aa461::CheckType(ctx,&node->super_ExprBase,pVVar4);
    break;
  case EXPR_CAST_ARRAY_PTR_TO_UNSIZED:
    pTVar9 = getType<TypeRef>(node->value->type);
    if (pTVar9 != (TypeRef *)0x0) {
      pTVar6 = getType<TypeArray>(pTVar9->subType);
      if (pTVar6 == (TypeArray *)0x0) {
        __assert_fail("arrType",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                      ,0xaba,
                      "VmValue *CompileVmTypeCast(ExpressionContext &, VmModule *, ExprTypeCast *)")
        ;
      }
      if ((pTVar6->length & 0xffffffffU) == pTVar6->length) {
        pVVar2 = (VmModule *)(node->super_ExprBase).source;
        VVar13 = GetVmType(ctx,(node->super_ExprBase).type);
        pVVar7 = CreateConstantInt(module->allocator,(node->super_ExprBase).source,
                                   (int)pTVar6->length);
        refType_1 = VVar13._0_8_;
        local_d0 = VVar13.structType;
        type_07.structType = (TypeBase *)pVVar4;
        type_07._0_8_ = local_d0;
        pVVar4 = anon_unknown.dwarf_aa461::CreateConstruct
                           ((anon_unknown_dwarf_aa461 *)module,pVVar2,(SynBase *)refType_1,type_07,
                            &pVVar7->super_VmValue,(VmValue *)0x0,(VmValue *)0x0,
                            in_stack_fffffffffffffb88);
        pVVar4 = anon_unknown.dwarf_aa461::CheckType(ctx,&node->super_ExprBase,pVVar4);
        return pVVar4;
      }
      __assert_fail("unsigned(arrType->length) == arrType->length",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                    ,0xabb,
                    "VmValue *CompileVmTypeCast(ExpressionContext &, VmModule *, ExprTypeCast *)");
    }
    goto LAB_0020735b;
  case EXPR_CAST_PTR_TO_AUTO_PTR:
    pTVar9 = getType<TypeRef>(node->value->type);
    if (pTVar9 != (TypeRef *)0x0) {
      pTVar8 = getType<TypeClass>(pTVar9->subType);
      if ((pTVar8 == (TypeClass *)0x0) ||
         (((pTVar8->extendable & 1U) == 0 && (pTVar8->baseClass == (TypeClass *)0x0)))) {
        local_f0 = anon_unknown.dwarf_aa461::CreateTypeIndex
                             (module,(node->super_ExprBase).source,pTVar9->subType);
      }
      else {
        local_f0 = anon_unknown.dwarf_aa461::CreateLoad
                             (ctx,module,(node->super_ExprBase).source,ctx->typeTypeID,pVVar4,0);
      }
      pVVar2 = (VmModule *)(node->super_ExprBase).source;
      VVar13 = GetVmType(ctx,(node->super_ExprBase).type);
      refType_2 = VVar13._0_8_;
      local_f8 = VVar13.structType;
      type_00.structType = (TypeBase *)local_f0;
      type_00._0_8_ = local_f8;
      pVVar4 = anon_unknown.dwarf_aa461::CreateConstruct
                         ((anon_unknown_dwarf_aa461 *)module,pVVar2,(SynBase *)refType_2,type_00,
                          pVVar4,(VmValue *)0x0,(VmValue *)0x0,in_stack_fffffffffffffb88);
      pVVar4 = anon_unknown.dwarf_aa461::CheckType(ctx,&node->super_ExprBase,pVVar4);
      return pVVar4;
    }
    goto LAB_0020735b;
  case EXPR_CAST_AUTO_PTR_TO_PTR:
    pTVar9 = getType<TypeRef>((node->super_ExprBase).type);
    if (pTVar9 != (TypeRef *)0x0) {
      pSVar1 = (node->super_ExprBase).source;
      type = pTVar9->subType;
      pTVar9 = ExpressionContext::GetReferenceType(ctx,pTVar9->subType);
      pVVar4 = anon_unknown.dwarf_aa461::CreateConvertPtr
                         (module,pSVar1,pVVar4,type,&pTVar9->super_TypeBase);
      pVVar4 = anon_unknown.dwarf_aa461::CheckType(ctx,&node->super_ExprBase,pVVar4);
      return pVVar4;
    }
    goto LAB_0020735b;
  case EXPR_CAST_UNSIZED_TO_AUTO_ARRAY:
    pTVar10 = getType<TypeUnsizedArray>(node->value->type);
    if (pTVar10 != (TypeUnsizedArray *)0x0) {
      pVVar2 = (VmModule *)(node->super_ExprBase).source;
      VVar13 = GetVmType(ctx,(node->super_ExprBase).type);
      pVVar11 = anon_unknown.dwarf_aa461::CreateTypeIndex
                          (module,(node->super_ExprBase).source,pTVar10->subType);
      inst = VVar13._0_8_;
      local_118 = VVar13.structType;
      type_08.structType = (TypeBase *)pVVar11;
      type_08._0_8_ = local_118;
      pVVar4 = anon_unknown.dwarf_aa461::CreateConstruct
                         ((anon_unknown_dwarf_aa461 *)module,pVVar2,(SynBase *)inst,type_08,pVVar4,
                          (VmValue *)0x0,(VmValue *)0x0,in_stack_fffffffffffffb88);
      pVVar4 = anon_unknown.dwarf_aa461::CheckType(ctx,&node->super_ExprBase,pVVar4);
      return pVVar4;
    }
LAB_0020735b:
    ctx_local = (ExpressionContext *)
                anon_unknown.dwarf_aa461::CheckType(ctx,&node->super_ExprBase,pVVar4);
    break;
  case EXPR_CAST_REINTERPRET:
    if ((node->super_ExprBase).type == node->value->type) {
      ctx_local = (ExpressionContext *)
                  anon_unknown.dwarf_aa461::CheckType(ctx,&node->super_ExprBase,pVVar4);
    }
    else {
      bVar3 = isType<TypeUnsizedArray>((node->super_ExprBase).type);
      if ((bVar3) && (bVar3 = isType<TypeUnsizedArray>(node->value->type), bVar3)) {
        pVVar12 = getType<VmInstruction>(pVVar4);
        if ((pVVar12 == (VmInstruction *)0x0) || (pVVar12->cmd != VM_INST_CALL)) {
          pVVar2 = (VmModule *)(node->super_ExprBase).source;
          VVar13 = GetVmType(ctx,(node->super_ExprBase).type);
          inst_1 = VVar13._0_8_;
          local_140 = VVar13.structType;
          type_09.structType = (TypeBase *)pVVar4;
          type_09._0_8_ = local_140;
          pVVar4 = anon_unknown.dwarf_aa461::CreateBitcast
                             ((anon_unknown_dwarf_aa461 *)module,pVVar2,(SynBase *)inst_1,type_09,
                              in_R9);
          ctx_local = (ExpressionContext *)
                      anon_unknown.dwarf_aa461::CheckType(ctx,&node->super_ExprBase,pVVar4);
        }
        else {
          VVar13 = GetVmType(ctx,(node->super_ExprBase).type);
          local_138 = VVar13._0_8_;
          (pVVar12->super_VmValue).type.type = (undefined4)local_138;
          (pVVar12->super_VmValue).type.size = local_138._4_4_;
          local_130 = VVar13.structType;
          (pVVar12->super_VmValue).type.structType = local_130;
          ctx_local = (ExpressionContext *)
                      anon_unknown.dwarf_aa461::CheckType(ctx,&node->super_ExprBase,pVVar4);
        }
      }
      else {
        bVar3 = isType<TypeRef>((node->super_ExprBase).type);
        if ((bVar3) && (bVar3 = isType<TypeRef>(node->value->type), bVar3)) {
          pVVar12 = getType<VmInstruction>(pVVar4);
          if ((pVVar12 == (VmInstruction *)0x0) || (pVVar12->cmd != VM_INST_CALL)) {
            pVVar2 = (VmModule *)(node->super_ExprBase).source;
            VVar13 = GetVmType(ctx,(node->super_ExprBase).type);
            inst_2 = VVar13._0_8_;
            local_168 = VVar13.structType;
            type_10.structType = (TypeBase *)pVVar4;
            type_10._0_8_ = local_168;
            pVVar4 = anon_unknown.dwarf_aa461::CreateBitcast
                               ((anon_unknown_dwarf_aa461 *)module,pVVar2,(SynBase *)inst_2,type_10,
                                in_R9);
            ctx_local = (ExpressionContext *)
                        anon_unknown.dwarf_aa461::CheckType(ctx,&node->super_ExprBase,pVVar4);
          }
          else {
            VVar13 = GetVmType(ctx,(node->super_ExprBase).type);
            local_160 = VVar13._0_8_;
            (pVVar12->super_VmValue).type.type = (undefined4)local_160;
            (pVVar12->super_VmValue).type.size = local_160._4_4_;
            local_158 = VVar13.structType;
            (pVVar12->super_VmValue).type.structType = local_158;
            ctx_local = (ExpressionContext *)
                        anon_unknown.dwarf_aa461::CheckType(ctx,&node->super_ExprBase,pVVar4);
          }
        }
        else {
          bVar3 = isType<TypeFunction>((node->super_ExprBase).type);
          if ((bVar3) && (bVar3 = isType<TypeFunction>(node->value->type), bVar3)) {
            pVVar12 = getType<VmInstruction>(pVVar4);
            if ((pVVar12 == (VmInstruction *)0x0) || (pVVar12->cmd != VM_INST_CALL)) {
              pVVar2 = (VmModule *)(node->super_ExprBase).source;
              VVar13 = GetVmType(ctx,(node->super_ExprBase).type);
              local_198 = VVar13._0_8_;
              local_190 = VVar13.structType;
              VVar13.structType = (TypeBase *)pVVar4;
              VVar13._0_8_ = local_190;
              pVVar4 = anon_unknown.dwarf_aa461::CreateBitcast
                                 ((anon_unknown_dwarf_aa461 *)module,pVVar2,local_198,VVar13,in_R9);
              ctx_local = (ExpressionContext *)
                          anon_unknown.dwarf_aa461::CheckType(ctx,&node->super_ExprBase,pVVar4);
            }
            else {
              VVar13 = GetVmType(ctx,(node->super_ExprBase).type);
              local_188 = VVar13._0_8_;
              (pVVar12->super_VmValue).type.type = (undefined4)local_188;
              (pVVar12->super_VmValue).type.size = local_188._4_4_;
              local_180 = VVar13.structType;
              (pVVar12->super_VmValue).type.structType = local_180;
              ctx_local = (ExpressionContext *)
                          anon_unknown.dwarf_aa461::CheckType(ctx,&node->super_ExprBase,pVVar4);
            }
          }
          else {
            ctx_local = (ExpressionContext *)
                        anon_unknown.dwarf_aa461::CheckType(ctx,&node->super_ExprBase,pVVar4);
          }
        }
      }
    }
    break;
  default:
    __assert_fail("!\"unknown cast\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                  ,0xb12,
                  "VmValue *CompileVmTypeCast(ExpressionContext &, VmModule *, ExprTypeCast *)");
  }
  return (VmValue *)ctx_local;
}

Assistant:

VmValue* CompileVmTypeCast(ExpressionContext &ctx, VmModule *module, ExprTypeCast *node)
{
	VmValue *value = CompileVm(ctx, module, node->value);

	switch(node->category)
	{
	case EXPR_CAST_NUMERICAL:
		if(node->type == ctx.typeBool)
		{
			if(value->type == VmType::Int)
				return CheckType(ctx, node, CreateCompareNotEqual(module, node->source, value, CreateConstantInt(module->allocator, node->source, 0)));

			if(value->type == VmType::Double)
				return CheckType(ctx, node, CreateCompareNotEqual(module, node->source, value, CreateConstantDouble(module->allocator, node->source, 0.0)));

			if(value->type == VmType::Long)
				return CheckType(ctx, node, CreateCompareNotEqual(module, node->source, value, CreateConstantLong(module->allocator, node->source, 0ll)));

			assert(!"unknown type");
		}

		return CheckType(ctx, node, CreateCast(module, node->source, value, GetVmType(ctx, node->type)));
	case EXPR_CAST_PTR_TO_BOOL:
		return CheckType(ctx, node, CreateCompareNotEqual(module, node->source, value, CreateConstantPointer(module->allocator, node->source, 0, NULL, ctx.typeNullPtr, false)));
	case EXPR_CAST_UNSIZED_TO_BOOL:
		if(TypeUnsizedArray *unsizedArrType = getType<TypeUnsizedArray>(node->value->type))
		{
			VmValue *ptr = CreateExtract(module, node->source, VmType::Pointer(ctx.GetReferenceType(unsizedArrType->subType)), value, 0);

			return CheckType(ctx, node, CreateCompareNotEqual(module, node->source, ptr, CreateConstantPointer(module->allocator, node->source, 0, NULL, ctx.typeNullPtr, false)));
		}
		
		break;
	case EXPR_CAST_FUNCTION_TO_BOOL:
		if(VmValue *index = CreateExtract(module, node->source, VmType::Int, value, sizeof(void*)))
		{
			return CheckType(ctx, node, CreateCompareNotEqual(module, node->source, index, CreateConstantInt(module->allocator, node->source, 0)));
		}

		break;
	case EXPR_CAST_NULL_TO_PTR:
		return CheckType(ctx, node, CreateConstantPointer(module->allocator, node->source, 0, NULL, node->type, false));
	case EXPR_CAST_NULL_TO_AUTO_PTR:
		return CheckType(ctx, node, CreateConstruct(module, node->source, GetVmType(ctx, node->type), CreateConstantInt(module->allocator, node->source, 0), CreateConstantPointer(module->allocator, node->source, 0, NULL, ctx.typeNullPtr, false), NULL, NULL));
	case EXPR_CAST_NULL_TO_UNSIZED:
		return CheckType(ctx, node, CreateConstruct(module, node->source, GetVmType(ctx, node->type), CreateConstantPointer(module->allocator, node->source, 0, NULL, ctx.typeNullPtr, false), CreateConstantInt(module->allocator, node->source, 0), NULL, NULL));
	case EXPR_CAST_NULL_TO_AUTO_ARRAY:
		return CheckType(ctx, node, CreateConstruct(module, node->source, GetVmType(ctx, node->type), CreateConstantInt(module->allocator, node->source, 0), CreateConstantPointer(module->allocator, node->source, 0, NULL, ctx.typeNullPtr, false), CreateConstantInt(module->allocator, node->source, 0), NULL));
	case EXPR_CAST_NULL_TO_FUNCTION:
		return CheckType(ctx, node, CreateConstruct(module, node->source, GetVmType(ctx, node->type), CreateConstantPointer(module->allocator, node->source, 0, NULL, ctx.typeNullPtr, false), CreateConstantInt(module->allocator, node->source, 0), NULL, NULL));
	case EXPR_CAST_ARRAY_PTR_TO_UNSIZED:
		if(TypeRef *refType = getType<TypeRef>(node->value->type))
		{
			TypeArray *arrType = getType<TypeArray>(refType->subType);

			assert(arrType);
			assert(unsigned(arrType->length) == arrType->length);

			return CheckType(ctx, node, CreateConstruct(module, node->source, GetVmType(ctx, node->type), value, CreateConstantInt(module->allocator, node->source, unsigned(arrType->length)), NULL, NULL));
		}

		break;
	case EXPR_CAST_PTR_TO_AUTO_PTR:
		if(TypeRef *refType = getType<TypeRef>(node->value->type))
		{
			TypeClass *classType = getType<TypeClass>(refType->subType);

			VmValue *typeId = NULL;

			if(classType && (classType->extendable || classType->baseClass))
				typeId = CreateLoad(ctx, module, node->source, ctx.typeTypeID, value, 0);
			else
				typeId = CreateTypeIndex(module, node->source, refType->subType);

			return CheckType(ctx, node, CreateConstruct(module, node->source, GetVmType(ctx, node->type), typeId, value, NULL, NULL));
		}
		break;
	case EXPR_CAST_AUTO_PTR_TO_PTR:
		if(TypeRef *refType = getType<TypeRef>(node->type))
		{
			return CheckType(ctx, node, CreateConvertPtr(module, node->source, value, refType->subType, ctx.GetReferenceType(refType->subType)));
		}

		break;
	case EXPR_CAST_UNSIZED_TO_AUTO_ARRAY:
		if(TypeUnsizedArray *unsizedType = getType<TypeUnsizedArray>(node->value->type))
		{
			return CheckType(ctx, node, CreateConstruct(module, node->source, GetVmType(ctx, node->type), CreateTypeIndex(module, node->source, unsizedType->subType), value, NULL, NULL));
		}

		break;
	case EXPR_CAST_REINTERPRET:
		if(node->type == node->value->type)
			return CheckType(ctx, node, value);

		if(isType<TypeUnsizedArray>(node->type) && isType<TypeUnsizedArray>(node->value->type))
		{
			// Try changing the target call type
			if(VmInstruction *inst = getType<VmInstruction>(value))
			{
				if(inst->cmd == VM_INST_CALL)
				{
					inst->type = GetVmType(ctx, node->type);

					return CheckType(ctx, node, value);
				}
			}

			return CheckType(ctx, node, CreateBitcast(module, node->source, GetVmType(ctx, node->type), value));
		}
		else if(isType<TypeRef>(node->type) && isType<TypeRef>(node->value->type))
		{
			// Try changing the target call type
			if(VmInstruction *inst = getType<VmInstruction>(value))
			{
				if(inst->cmd == VM_INST_CALL)
				{
					inst->type = GetVmType(ctx, node->type);

					return CheckType(ctx, node, value);
				}
			}

			return CheckType(ctx, node, CreateBitcast(module, node->source, GetVmType(ctx, node->type), value));
		}
		else if(isType<TypeFunction>(node->type) && isType<TypeFunction>(node->value->type))
		{
			// Try changing the target call type
			if(VmInstruction *inst = getType<VmInstruction>(value))
			{
				if(inst->cmd == VM_INST_CALL)
				{
					inst->type = GetVmType(ctx, node->type);

					return CheckType(ctx, node, value);
				}
			}

			return CheckType(ctx, node, CreateBitcast(module, node->source, GetVmType(ctx, node->type), value));
		}

		return CheckType(ctx, node, value);
	default:
		assert(!"unknown cast");
	}

	return CheckType(ctx, node, value);
}